

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::framebufferTextureLayer
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 texture,int level,
          int layer)

{
  Type TVar1;
  Framebuffer *pFVar2;
  Framebuffer *pFVar3;
  Texture *pTVar4;
  TexTarget TVar5;
  int iVar6;
  Framebuffer *pFVar7;
  Attachment *attachment_00;
  int iVar8;
  bool bVar9;
  float fVar10;
  long lStack_50;
  
  if (attachment == 0x8d20) {
    lStack_50 = 2;
LAB_004868ac:
    bVar9 = false;
  }
  else if (attachment == 0x8ce0) {
    bVar9 = false;
    lStack_50 = 0;
  }
  else {
    if (attachment == 0x8d00) {
      lStack_50 = 1;
      goto LAB_004868ac;
    }
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x1f])
                (this,(ulong)target,0x8d00,(ulong)texture,(ulong)(uint)level,(ulong)(uint)layer);
      (*(this->super_Context)._vptr_Context[0x1f])
                (this,(ulong)target,0x8d20,(ulong)texture,(ulong)(uint)level,(ulong)(uint)layer);
      return;
    }
    lStack_50 = 3;
    bVar9 = true;
  }
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar9)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  pFVar2 = this->m_readFramebufferBinding;
  pFVar3 = this->m_drawFramebufferBinding;
  pFVar7 = pFVar2;
  if (target == 0x8ca9) {
    pFVar7 = pFVar3;
  }
  if (target == 0x8d40) {
    pFVar7 = pFVar3;
  }
  if (pFVar7 == (Framebuffer *)0x0) {
LAB_00486a41:
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x502;
    return;
  }
  if (texture == 0) {
    pTVar4 = (Texture *)0x0;
LAB_00486985:
    iVar8 = (uint)(pFVar7 == pFVar2) + (uint)(pFVar7 == pFVar3);
    attachment_00 = pFVar7->m_attachments + lStack_50;
    iVar6 = iVar8;
    while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
      releaseFboAttachmentReference(this,attachment_00);
    }
    attachment_00->type = ATTACHMENTTYPE_LAST;
    attachment_00->name = 0;
    pFVar7->m_attachments[lStack_50].texTarget = TEXTARGET_LAST;
    pFVar7->m_attachments[lStack_50].level = 0;
    pFVar7->m_attachments[lStack_50].layer = 0;
    if (pTVar4 != (Texture *)0x0) {
      attachment_00->type = ATTACHMENTTYPE_TEXTURE;
      pFVar7->m_attachments[lStack_50].name = (pTVar4->super_NamedObject).m_name;
      TVar5 = TEXTARGET_LAST;
      if (pTVar4->m_type - TYPE_2D_ARRAY < 3) {
        TVar5 = pTVar4->m_type + TYPE_3D;
      }
      pFVar7->m_attachments[lStack_50].texTarget = TVar5;
      pFVar7->m_attachments[lStack_50].level = level;
      pFVar7->m_attachments[lStack_50].layer = layer;
      while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
        acquireFboAttachmentReference(this,attachment_00);
      }
    }
  }
  else {
    pTVar4 = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,texture);
    if (pTVar4 == (Texture *)0x0) goto LAB_00486a41;
    if (level == 0) {
      TVar1 = pTVar4->m_type;
      if (TVar1 == TYPE_2D_ARRAY) {
LAB_00486a29:
        if (0x88fe < (uint)layer) goto LAB_00486966;
        fVar10 = 3379.0;
      }
      else {
        if (TVar1 != TYPE_3D) {
          if (TVar1 != TYPE_CUBE_MAP_ARRAY) goto LAB_00486a41;
          goto LAB_00486a29;
        }
        if (0x8072 < (uint)layer) goto LAB_00486966;
        fVar10 = 32883.0;
      }
      fVar10 = deFloatLog2(fVar10);
      if (0.0 <= fVar10) goto LAB_00486985;
    }
LAB_00486966:
    if (this->m_lastError == 0) {
      this->m_lastError = 0x501;
    }
  }
  return;
}

Assistant:

void ReferenceContext::framebufferTextureLayer (deUint32 target, deUint32 attachment, deUint32 texture, int level, int layer)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach to both depth and stencil.
		framebufferTextureLayer(target, GL_DEPTH_ATTACHMENT,	texture, level, layer);
		framebufferTextureLayer(target, GL_STENCIL_ATTACHMENT,	texture, level, layer);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Texture*						texObj			= DE_NULL;

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (texture != 0)
		{
			texObj = m_textures.find(texture);

			RC_IF_ERROR(!texObj,		GL_INVALID_OPERATION,	RC_RET_VOID);
			RC_IF_ERROR(level != 0,		GL_INVALID_VALUE,		RC_RET_VOID); // \todo [2012-03-19 pyry] We should allow other levels as well.

			RC_IF_ERROR(texObj->getType() != Texture::TYPE_2D_ARRAY			&&
						texObj->getType() != Texture::TYPE_3D				&&
						texObj->getType() != Texture::TYPE_CUBE_MAP_ARRAY,				GL_INVALID_OPERATION,	RC_RET_VOID);

			if (texObj->getType() == Texture::TYPE_2D_ARRAY || texObj->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
			{
				RC_IF_ERROR((layer < 0) || (layer >= GL_MAX_ARRAY_TEXTURE_LAYERS),		GL_INVALID_VALUE,		RC_RET_VOID);
				RC_IF_ERROR((level < 0) || (level > deFloatLog2(GL_MAX_TEXTURE_SIZE)),	GL_INVALID_VALUE,		RC_RET_VOID);
			}
			else if	(texObj->getType() == Texture::TYPE_3D)
			{
				RC_IF_ERROR((layer < 0) || (layer >= GL_MAX_3D_TEXTURE_SIZE),				GL_INVALID_VALUE,		RC_RET_VOID);
				RC_IF_ERROR((level < 0) || (level > deFloatLog2(GL_MAX_3D_TEXTURE_SIZE)),	GL_INVALID_VALUE,		RC_RET_VOID);
			}
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (texObj)
		{
			fboAttachment.type			= Framebuffer::ATTACHMENTTYPE_TEXTURE;
			fboAttachment.name			= texObj->getName();
			fboAttachment.texTarget		= texLayeredTypeToTarget(texObj->getType());
			fboAttachment.level			= level;
			fboAttachment.layer			= layer;

			DE_ASSERT(fboAttachment.texTarget != Framebuffer::TEXTARGET_LAST);

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}